

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
cppcms::crypto::message_digest::create_by_name(string *namein)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ssl_sha384 *this;
  string *in_RSI;
  __uniq_ptr_data<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>,_true,_true>
  in_RDI;
  uint i;
  string name;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *d;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  ssl_sha512 *in_stack_ffffffffffffff40;
  uint local_48;
  string local_38 [39];
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::
  unique_ptr<cppcms::crypto::message_digest,std::default_delete<cppcms::crypto::message_digest>>::
  unique_ptr<std::default_delete<cppcms::crypto::message_digest>,void>
            ((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
              *)in_stack_ffffffffffffff30);
  std::__cxx11::string::string(local_38,local_10);
  for (local_48 = 0; uVar3 = std::__cxx11::string::size(), local_48 < uVar3; local_48 = local_48 + 1
      ) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (('@' < *pcVar4) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar4 < '[')) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      cVar1 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      *pcVar4 = cVar1 + ' ';
    }
  }
  bVar2 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  if (bVar2) {
    md5();
    std::
    unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ::operator=((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                 *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::
    unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ::~unique_ptr((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                   *)in_stack_ffffffffffffff30);
  }
  else {
    bVar2 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    if (bVar2) {
      sha1();
      std::
      unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
      ::operator=((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                   *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::
      unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
      ::~unique_ptr((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                     *)in_stack_ffffffffffffff30);
    }
    else {
      bVar2 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      if (bVar2) {
        operator_new(0x78);
        anon_unknown_3::ssl_sha224::ssl_sha224((ssl_sha224 *)in_stack_ffffffffffffff40);
        std::
        unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
        ::reset((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                 *)in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
      }
      else {
        bVar2 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        if (bVar2) {
          operator_new(0x78);
          anon_unknown_3::ssl_sha256::ssl_sha256((ssl_sha256 *)in_stack_ffffffffffffff40);
          std::
          unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
          ::reset((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                   *)in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
        }
        else {
          bVar2 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
          if (bVar2) {
            this = (ssl_sha384 *)operator_new(0xe0);
            anon_unknown_3::ssl_sha384::ssl_sha384(this);
            std::
            unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
            ::reset((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                     *)in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
          }
          else {
            bVar2 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
            if (bVar2) {
              in_stack_ffffffffffffff30 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   operator_new(0xe0);
              anon_unknown_3::ssl_sha512::ssl_sha512(in_stack_ffffffffffffff40);
              std::
              unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
              ::reset((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                       *)in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
            }
          }
        }
      }
    }
  }
  local_11 = 1;
  std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    std::
    unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ::~unique_ptr((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                   *)in_stack_ffffffffffffff30);
  }
  return (__uniq_ptr_data<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>,_true,_true>
          )(tuple<cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
            )in_RDI.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<message_digest> message_digest::create_by_name(std::string const &namein)
	{
		std::unique_ptr<message_digest> d;
		std::string name = namein;
		for(unsigned i=0;i<name.size();i++)
			if('A' <= name[i] && name[i]<='Z')
				name[i] = name[i] - 'A' + 'a';
		if(name=="md5")
			d = md5();
		else if(name == "sha1")
			d = sha1();
		#ifdef CPPCMS_HAVE_GCRYPT
		else if(name == "sha224")
			d.reset(new gcrypt_digets(GCRY_MD_SHA224));
		else if(name == "sha256")
			d.reset(new gcrypt_digets(GCRY_MD_SHA256));
		else if(name == "sha384")
			d.reset(new gcrypt_digets(GCRY_MD_SHA384));
		else if(name == "sha512")
			d.reset(new gcrypt_digets(GCRY_MD_SHA512));
		#endif

		#ifdef CPPCMS_HAVE_OPENSSL
		else if(name == "sha224")
			d.reset(new ssl_sha224());
		else if(name == "sha256")
			d.reset(new ssl_sha256());
		else if(name == "sha384")
			d.reset(new ssl_sha384());
		else if(name == "sha512")
			d.reset(new ssl_sha512());
		#endif
		
		return d;
	}